

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCofactoring(uint *pTruth,int nVars,int *pCofVars,int nLimit,int fVerbose)

{
  Kit_DsdObj_t KVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *__ptr;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Kit_DsdNtk_t *pKVar10;
  Kit_DsdNtk_t *pKVar11;
  Kit_DsdNtk_t *pNtk;
  undefined1 *puVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint **ppuVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  Kit_DsdNtk_t **ppKVar23;
  int iVar24;
  int pTryVars [16];
  uint *ppCofs [5] [16];
  Kit_DsdNtk_t *ppNtks [5] [16];
  int local_620;
  int local_618;
  uint local_610;
  uint **local_5f0;
  ulong local_5d8;
  int local_578 [16];
  uint *local_538 [80];
  Kit_DsdNtk_t *local_2b8 [17];
  undefined1 local_230 [512];
  
  memset(local_2b8,0,0x280);
  if (4 < nLimit) {
    __assert_fail("nLimit < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xa86,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  bVar13 = (byte)(nVars + -5);
  iVar5 = 0x50 << (bVar13 & 0x1f);
  if (nVars < 6) {
    iVar5 = 0x50;
  }
  iVar24 = nVars + -5;
  if (nVars < 6) {
    iVar24 = 0;
  }
  local_538[0] = (uint *)malloc((long)iVar5 << 2);
  ppuVar17 = local_538;
  lVar19 = 0;
  iVar5 = 0;
  do {
    iVar8 = iVar5;
    lVar22 = 0;
    do {
      ppuVar17[lVar22] = local_538[0] + (iVar8 + (int)lVar22 << ((byte)iVar24 & 0x1f));
      __ptr = local_538[0];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0x10);
    lVar19 = lVar19 + 1;
    ppuVar17 = ppuVar17 + 0x10;
    iVar5 = iVar8 + 0x10;
  } while (lVar19 != 5);
  uVar6 = 1 << (bVar13 & 0x1f);
  if (nVars < 6) {
    uVar6 = 1;
  }
  if (iVar8 != 0x40) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xa8f,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  if (0 < (int)uVar6) {
    lVar19 = (ulong)uVar6 + 1;
    do {
      local_538[0][lVar19 + -2] = pTruth[lVar19 + -2];
      lVar19 = lVar19 + -1;
    } while (1 < lVar19);
  }
  iVar5 = 0;
  local_2b8[0] = Kit_DsdDecomposeInt(local_538[0],nVars,0);
  if (fVerbose != 0) {
    printf("\nProcessing prime function with %d support variables:\n",(ulong)(uint)nVars);
  }
  if (0 < nLimit) {
    local_5f0 = local_538;
    puVar12 = local_230;
    uVar16 = 0;
    do {
      uVar18 = 1 << ((byte)uVar16 & 0x1f);
      uVar6 = Kit_DsdCofactoringGetVars(local_2b8 + uVar16 * 0x10,uVar18,local_578);
      if (uVar6 == 0) goto LAB_00535c25;
      local_5d8 = (ulong)uVar18;
      if ((int)uVar6 < 1) {
        local_620 = -1;
      }
      else {
        lVar19 = uVar16 + 1;
        local_620 = -1;
        local_610 = 10000;
        uVar15 = 0;
        local_618 = 10000;
        do {
          iVar5 = local_578[uVar15];
          uVar14 = 0;
          iVar24 = 0;
          uVar18 = 0;
          do {
            puVar2 = local_538[lVar19 * 0x10 + uVar14 * 2];
            puVar3 = local_538[uVar16 * 0x10 + uVar14];
            Kit_TruthCofactor0New(puVar2,puVar3,nVars,iVar5);
            puVar4 = local_538[lVar19 * 0x10 + uVar14 * 2 + 1];
            Kit_TruthCofactor1New(puVar4,puVar3,nVars,iVar5);
            pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
            local_2b8[lVar19 * 0x10 + uVar14 * 2] = pKVar10;
            pKVar11 = Kit_DsdDecomposeInt(puVar4,nVars,0);
            local_2b8[lVar19 * 0x10 + uVar14 * 2 + 1] = pKVar11;
            uVar7 = 0;
            if ((ulong)pKVar10->nNodes != 0) {
              uVar20 = 0;
              uVar7 = 0;
              do {
                if (pKVar10->pNodes[uVar20] == (Kit_DsdObj_t *)0x0) break;
                KVar1 = *pKVar10->pNodes[uVar20];
                uVar21 = (uint)KVar1 >> 0x1a;
                if (uVar21 < uVar7) {
                  uVar21 = uVar7;
                }
                if (((uint)KVar1 & 0x1c0) == 0x140) {
                  uVar7 = uVar21;
                }
                uVar20 = uVar20 + 1;
              } while (pKVar10->nNodes != uVar20);
            }
            if (uVar7 < uVar18) {
              uVar7 = uVar18;
            }
            if ((ulong)pKVar11->nNodes == 0) {
              uVar18 = 0;
            }
            else {
              uVar20 = 0;
              uVar18 = 0;
              do {
                if (pKVar11->pNodes[uVar20] == (Kit_DsdObj_t *)0x0) break;
                KVar1 = *pKVar11->pNodes[uVar20];
                uVar21 = (uint)KVar1 >> 0x1a;
                if (uVar21 < uVar18) {
                  uVar21 = uVar18;
                }
                if (((uint)KVar1 & 0x1c0) == 0x140) {
                  uVar18 = uVar21;
                }
                uVar20 = uVar20 + 1;
              } while (pKVar11->nNodes != uVar20);
            }
            if (uVar18 < uVar7) {
              uVar18 = uVar7;
            }
            iVar8 = Kit_TruthSupportSize(puVar2,nVars);
            iVar9 = Kit_TruthSupportSize(puVar4,nVars);
            iVar24 = iVar9 + iVar24 + iVar8;
            Kit_DsdNtkFree(pKVar10);
            Kit_DsdNtkFree(pKVar11);
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_5d8);
          if ((uVar18 < local_610) || ((local_610 == uVar18 && (iVar24 < local_618)))) {
            local_620 = local_578[uVar15];
            local_618 = iVar24;
            local_610 = uVar18;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar6);
      }
      if (local_620 == -1) {
        __assert_fail("iVarBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                      ,0xac3,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
      }
      if (pCofVars != (int *)0x0) {
        pCofVars[uVar16] = local_620;
      }
      uVar16 = uVar16 + 1;
      uVar15 = 0;
      do {
        puVar2 = local_5f0[uVar15 + 0x10];
        puVar3 = *(uint **)((long)local_5f0 + uVar15 * 4);
        Kit_TruthCofactor0New(puVar2,puVar3,nVars,local_620);
        puVar4 = local_5f0[uVar15 + 0x11];
        Kit_TruthCofactor1New(puVar4,puVar3,nVars,local_620);
        pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
        *(Kit_DsdNtk_t **)(puVar12 + uVar15 * 8 + -8) = pKVar10;
        pKVar11 = Kit_DsdDecomposeInt(puVar4,nVars,0);
        *(Kit_DsdNtk_t **)(puVar12 + uVar15 * 8) = pKVar11;
        if (fVerbose != 0) {
          pNtk = Kit_DsdExpand(pKVar10);
          *(Kit_DsdNtk_t **)(puVar12 + uVar15 * 8 + -8) = pNtk;
          Kit_DsdNtkFree(pKVar10);
          pKVar10 = Kit_DsdExpand(pKVar11);
          *(Kit_DsdNtk_t **)(puVar12 + uVar15 * 8) = pKVar10;
          Kit_DsdNtkFree(pKVar11);
          printf("Cof%d%d: ",uVar16 & 0xffffffff,uVar15 & 0xffffffff);
          Kit_DsdPrint(_stdout,pNtk);
          putchar(10);
          printf("Cof%d%d: ",uVar16 & 0xffffffff,(ulong)((int)uVar15 + 1));
          Kit_DsdPrint(_stdout,pKVar10);
          putchar(10);
        }
        uVar15 = uVar15 + 2;
        local_5d8 = local_5d8 - 1;
      } while (local_5d8 != 0);
      local_5f0 = local_5f0 + 0x10;
      puVar12 = puVar12 + 0x80;
    } while (uVar16 != (uint)nLimit);
    uVar16 = (ulong)(uint)nLimit;
LAB_00535c25:
    iVar5 = (int)uVar16;
  }
  ppKVar23 = local_2b8;
  lVar19 = 0;
  do {
    lVar22 = 0;
    do {
      if (ppKVar23[lVar22] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree(ppKVar23[lVar22]);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0x10);
    lVar19 = lVar19 + 1;
    ppKVar23 = ppKVar23 + 0x10;
  } while (lVar19 != 5);
  if (__ptr != (uint *)0x0) {
    free(__ptr);
    local_538[0] = (uint *)0x0;
  }
  if (nLimit < iVar5) {
    __assert_fail("nStep <= nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xae4,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  return iVar5;
}

Assistant:

int Kit_DsdCofactoring( unsigned * pTruth, int nVars, int * pCofVars, int nLimit, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[5][16] = {
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0}
    };
    Kit_DsdNtk_t * pTemp;
    unsigned * ppCofs[5][16];
    int pTryVars[16], nTryVars;
    int nPrimeSizeMin, nPrimeSizeMax, nPrimeSizeCur;
    int nSuppSizeMin, nSuppSizeMax, iVarBest;
    int i, k, v, nStep, nSize, nMemSize;
    assert( nLimit < 5 );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );
    ppNtks[0][0] = Kit_DsdDecompose( ppCofs[0][0], nVars );

    if ( fVerbose )
        printf( "\nProcessing prime function with %d support variables:\n", nVars );

    // perform recursive cofactoring
    for ( nStep = 0; nStep < nLimit; nStep++ )
    {
        nSize = (1 << nStep);
        // find the variables to use in the cofactoring step
        nTryVars = Kit_DsdCofactoringGetVars( ppNtks[nStep], nSize, pTryVars );
        if ( nTryVars == 0 )
            break;
        // cofactor w.r.t. the above variables
        iVarBest = -1;
        nPrimeSizeMin = 10000;
        nSuppSizeMin  = 10000;
        for ( v = 0; v < nTryVars; v++ )
        {
            nPrimeSizeMax = 0;
            nSuppSizeMax = 0;
            for ( i = 0; i < nSize; i++ )
            {
                // cofactor and decompose cofactors          
                Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, pTryVars[v] );
                Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, pTryVars[v] );
                ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
                ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
                // compute the largest non-decomp block
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+0]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+1]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                // compute the sum total of supports
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+0], nVars );
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+1], nVars );
                // free the networks
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+1] );
            }
            // find the min max support size of the prime component
            if ( nPrimeSizeMin > nPrimeSizeMax || (nPrimeSizeMin == nPrimeSizeMax && nSuppSizeMin > nSuppSizeMax) )
            {
                nPrimeSizeMin = nPrimeSizeMax;
                nSuppSizeMin  = nSuppSizeMax;
                iVarBest      = pTryVars[v];
            }
        }
        assert( iVarBest != -1 );
        // save the variable
        if ( pCofVars )
            pCofVars[nStep] = iVarBest;
        // cofactor w.r.t. the best
        for ( i = 0; i < nSize; i++ )
        {
            Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, iVarBest );
            Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, iVarBest );
            ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
            ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
            if ( fVerbose )
            {
                ppNtks[nStep+1][2*i+0] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( pTemp );
                ppNtks[nStep+1][2*i+1] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+1] );
                Kit_DsdNtkFree( pTemp );

                printf( "Cof%d%d: ", nStep+1, 2*i+0 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+0] ), printf( "\n" );
                printf( "Cof%d%d: ", nStep+1, 2*i+1 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+1] ), printf( "\n" );
            }
        }
    }

    // free the networks
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        if ( ppNtks[i][k] )
            Kit_DsdNtkFree( ppNtks[i][k] );
    ABC_FREE( ppCofs[0][0] );

    assert( nStep <= nLimit );
    return nStep;
}